

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O1

uint32 __thiscall
Protocol::MQTT::Common::VBInt::readFrom(VBInt *this,uint8 *buffer,uint32 bufLength)

{
  ushort uVar1;
  ushort uVar2;
  
  this->size = 0;
  while( true ) {
    uVar1 = this->size;
    if (bufLength <= uVar1) {
      return 0xfffffffe;
    }
    (this->field_0).value[uVar1] = buffer[uVar1];
    uVar1 = this->size;
    uVar2 = uVar1 + 1;
    this->size = uVar2;
    if (-1 < (char)(this->field_0).value[uVar1]) break;
    if (uVar2 == 4) {
      return 0xffffffff;
    }
  }
  return (uint)uVar2;
}

Assistant:

uint32 readFrom(const uint8 * buffer, uint32 bufLength)
                {
                    for (size = 0;;)
                    {
                        if ((uint32)(size+1) > bufLength) return NotEnoughData;
                        value[size] = buffer[size];
                        if (value[size++] < 0x80) break;
                        if (size == 4) return BadData;
                    }
                    return size;
                }